

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O2

SlicePlane * polyscope::addSceneSlicePlane(bool initiallyVisible)

{
  long *plVar1;
  SlicePlane *pSVar2;
  unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *s;
  long *plVar3;
  string newName;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  std::__cxx11::to_string(&local_88,(long)DAT_0059cd80 - (long)state::slicePlanes >> 3);
  std::operator+(&local_48,"Scene Slice Plane ",&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  pSVar2 = (SlicePlane *)operator_new(0x710);
  std::__cxx11::string::string((string *)&local_68,(string *)&local_48);
  SlicePlane::SlicePlane(pSVar2,&local_68);
  local_88._M_dataplus._M_p = (pointer)pSVar2;
  std::
  vector<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>,std::allocator<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>>>
  ::emplace_back<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>>
            ((vector<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>,std::allocator<std::unique_ptr<polyscope::SlicePlane,std::default_delete<polyscope::SlicePlane>>>>
              *)&state::slicePlanes,
             (unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)
             &local_88);
  std::unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_>::~unique_ptr
            ((unique_ptr<polyscope::SlicePlane,_std::default_delete<polyscope::SlicePlane>_> *)
             &local_88);
  std::__cxx11::string::~string((string *)&local_68);
  pSVar2 = (SlicePlane *)DAT_0059cd80[-1];
  plVar3 = state::slicePlanes;
  plVar1 = DAT_0059cd80;
  if (!initiallyVisible) {
    SlicePlane::setDrawPlane(pSVar2,false);
    SlicePlane::setDrawWidget(pSVar2,false);
    plVar3 = state::slicePlanes;
    plVar1 = DAT_0059cd80;
  }
  for (; plVar3 != plVar1; plVar3 = plVar3 + 1) {
    std::__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2>::reset
              ((__shared_ptr<polyscope::render::ShaderProgram,_(__gnu_cxx::_Lock_policy)2> *)
               (*plVar3 + 0x1d0));
  }
  std::__cxx11::string::~string((string *)&local_48);
  return pSVar2;
}

Assistant:

SlicePlane* addSceneSlicePlane(bool initiallyVisible) {
  size_t nPlanes = state::slicePlanes.size();
  std::string newName = "Scene Slice Plane " + std::to_string(nPlanes);
  state::slicePlanes.emplace_back(std::unique_ptr<SlicePlane>(new SlicePlane(newName)));
  nPlanes++;
  SlicePlane* newPlane = state::slicePlanes.back().get();
  if (!initiallyVisible) {
    newPlane->setDrawPlane(false);
    newPlane->setDrawWidget(false);
  }
  for (std::unique_ptr<SlicePlane>& s : state::slicePlanes) {
    s->resetVolumeSliceProgram();
  }
  return newPlane;
}